

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::any::val<std::__cxx11::string>(any *this)

{
  proxy *ppVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined *puVar3;
  error *peVar4;
  string local_38;
  
  if (this->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*this->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  if (*(char **)(puVar3 + 8) != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    iVar2 = strcmp("NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",*(char **)(puVar3 + 8));
    if (iVar2 != 0) {
      peVar4 = (error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E0006","");
      cov::error::error(peVar4,&local_38);
      __cxa_throw(peVar4,&cov::error::typeinfo,cov::error::~error);
    }
  }
  ppVar1 = this->mDat;
  if (ppVar1 != (proxy *)0x0) {
    if (ppVar1->protect_level < 2) {
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ppVar1->data + 1)
      ;
    }
    peVar4 = (error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000K","");
    cov::error::error(peVar4,&local_38);
    __cxa_throw(peVar4,&cov::error::typeinfo,cov::error::~error);
  }
  peVar4 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E0005","");
  cov::error::error(peVar4,&local_38);
  __cxa_throw(peVar4,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

T &val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			if (this->mDat->protect_level > 1)
				throw cov::error("E000K");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}